

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall
leveldb::DBTest_RecoverWithLargeLog_Test::TestBody(DBTest_RecoverWithLargeLog_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  int iVar4;
  undefined8 *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *pcVar6;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  Options options;
  undefined1 local_118 [32];
  undefined1 local_f8 [16];
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> local_e8 [8];
  undefined8 *local_e0;
  undefined1 local_d8 [32];
  string local_b8;
  void *local_98;
  Options local_90;
  
  DBTest::CurrentOptions(&local_90,&this->super_DBTest);
  DBTest::Reopen(&this->super_DBTest,&local_90);
  local_118._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_118 + 0x10),"big1","");
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_b8,'@');
  local_d8._0_8_ = local_118._16_8_;
  local_d8._8_8_ = local_118._24_8_;
  local_118._0_4_ = (int)local_b8._M_dataplus._M_p;
  local_118._4_4_ = local_b8._M_dataplus._M_p._4_4_;
  local_118._8_4_ = (undefined4)local_b8._M_string_length;
  local_118._12_4_ = local_b8._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_98);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            (local_e8,local_d8,(Status *)"Put(\"big1\", std::string(200000, \'1\'))");
  if (local_98 != (void *)0x0) {
    operator_delete__(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._16_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
    operator_delete((void *)local_118._16_8_);
  }
  puVar5 = local_e0;
  if (local_e8[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)(local_118 + 0x10));
    if (local_e0 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_e0;
    }
    iVar4 = 0x424;
  }
  else {
    if (local_e0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_e0 != local_e0 + 2) {
        operator_delete((void *)*local_e0);
      }
      operator_delete(puVar5);
    }
    local_118._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
    ;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_118 + 0x10),"big2","");
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_b8,'@');
    local_d8._0_8_ = local_118._16_8_;
    local_d8._8_8_ = local_118._24_8_;
    local_118._0_4_ = (int)local_b8._M_dataplus._M_p;
    local_118._4_4_ = local_b8._M_dataplus._M_p._4_4_;
    local_118._8_4_ = (undefined4)local_b8._M_string_length;
    local_118._12_4_ = local_b8._M_string_length._4_4_;
    (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_98);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              (local_e8,local_d8,(Status *)"Put(\"big2\", std::string(200000, \'2\'))");
    if (local_98 != (void *)0x0) {
      operator_delete__(local_98);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._16_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
      operator_delete((void *)local_118._16_8_);
    }
    puVar5 = local_e0;
    if (local_e8[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)(local_118 + 0x10));
      if (local_e0 == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (char *)*local_e0;
      }
      iVar4 = 0x425;
    }
    else {
      if (local_e0 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_e0 != local_e0 + 2) {
          operator_delete((void *)*local_e0);
        }
        operator_delete(puVar5);
      }
      local_118._16_8_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_118 + 0x10),"small3","");
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_b8,'\n');
      local_d8._0_8_ = local_118._16_8_;
      local_d8._8_8_ = local_118._24_8_;
      local_118._0_4_ = (int)local_b8._M_dataplus._M_p;
      local_118._4_4_ = local_b8._M_dataplus._M_p._4_4_;
      local_118._8_4_ = (undefined4)local_b8._M_string_length;
      local_118._12_4_ = local_b8._M_string_length._4_4_;
      (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_98);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                (local_e8,local_d8,(Status *)"Put(\"small3\", std::string(10, \'3\'))");
      if (local_98 != (void *)0x0) {
        operator_delete__(local_98);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._16_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
        operator_delete((void *)local_118._16_8_);
      }
      puVar5 = local_e0;
      if (local_e8[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
        testing::Message::Message((Message *)(local_118 + 0x10));
        if (local_e0 == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = (char *)*local_e0;
        }
        iVar4 = 0x426;
      }
      else {
        if (local_e0 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_e0 != local_e0 + 2) {
            operator_delete((void *)*local_e0);
          }
          operator_delete(puVar5);
        }
        local_118._16_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_118 + 0x10),"small4","");
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_b8,'\n');
        local_d8._0_8_ = local_118._16_8_;
        local_d8._8_8_ = local_118._24_8_;
        local_118._0_4_ = (int)local_b8._M_dataplus._M_p;
        local_118._4_4_ = local_b8._M_dataplus._M_p._4_4_;
        local_118._8_4_ = (undefined4)local_b8._M_string_length;
        local_118._12_4_ = local_b8._M_string_length._4_4_;
        (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_98);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  (local_e8,local_d8,(Status *)"Put(\"small4\", std::string(10, \'4\'))");
        if (local_98 != (void *)0x0) {
          operator_delete__(local_98);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._16_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
          operator_delete((void *)local_118._16_8_);
        }
        if (local_e8[0] != (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
          if (local_e0 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_e0 != local_e0 + 2) {
              operator_delete((void *)*local_e0);
            }
            operator_delete(local_e0);
          }
          iVar4 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,0);
          local_b8._M_dataplus._M_p._0_4_ = iVar4;
          local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)(local_118 + 0x10),"NumTableFilesAtLevel(0)","0",(int *)&local_b8,
                     (int *)local_d8);
          uVar2 = local_118[0x10];
          if (local_118[0x10] == '\0') {
            testing::Message::Message((Message *)&local_b8);
            if ((undefined8 *)local_118._24_8_ == (undefined8 *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = *(char **)local_118._24_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_d8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                       ,0x428,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_d8,(Message *)&local_b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
            if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
            }
          }
          uVar3 = local_118._24_8_;
          if ((undefined8 *)local_118._24_8_ != (undefined8 *)0x0) {
            if (*(void **)local_118._24_8_ != (void *)(local_118._24_8_ + 0x10)) {
              operator_delete(*(void **)local_118._24_8_);
            }
            operator_delete((void *)uVar3);
          }
          if (uVar2 == '\0') {
            return;
          }
          DBTest::CurrentOptions(&local_90,&this->super_DBTest);
          local_90.write_buffer_size = 100000;
          DBTest::Reopen(&this->super_DBTest,&local_90);
          iVar4 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,0);
          local_b8._M_dataplus._M_p._0_4_ = iVar4;
          local_d8._0_4_ = 3;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)(local_118 + 0x10),"NumTableFilesAtLevel(0)","3",(int *)&local_b8,
                     (int *)local_d8);
          uVar3 = local_118._24_8_;
          if (local_118[0x10] == '\0') {
            testing::Message::Message((Message *)&local_b8);
            if ((undefined8 *)local_118._24_8_ == (undefined8 *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = *(char **)local_118._24_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_d8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                       ,0x430,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_d8,(Message *)&local_b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
            puVar5 = (undefined8 *)local_118._24_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_b8._M_dataplus._M_p + 8))();
              puVar5 = (undefined8 *)local_118._24_8_;
            }
          }
          else {
            if ((undefined8 *)local_118._24_8_ != (undefined8 *)0x0) {
              if (*(void **)local_118._24_8_ != (void *)(local_118._24_8_ + 0x10)) {
                operator_delete(*(void **)local_118._24_8_);
              }
              operator_delete((void *)uVar3);
            }
            local_118._16_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
            std::__cxx11::string::_M_construct((ulong)(local_118 + 0x10),'@');
            local_d8._0_8_ = local_d8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"big1","");
            DBTest::Get(&local_b8,&this->super_DBTest,(string *)local_d8,(Snapshot *)0x0);
            testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                      ((internal *)local_118,"std::string(200000, \'1\')","Get(\"big1\")",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_118 + 0x10),&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar1) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
            if ((AssertHelperData *)local_d8._0_8_ != (AssertHelperData *)(local_d8 + 0x10)) {
              operator_delete((void *)local_d8._0_8_);
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_118._16_8_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
              operator_delete((void *)local_118._16_8_);
            }
            if (local_118[0] == false) {
              testing::Message::Message((Message *)(local_118 + 0x10));
              if ((undefined8 *)CONCAT44(local_118._12_4_,local_118._8_4_) == (undefined8 *)0x0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)CONCAT44(local_118._12_4_,local_118._8_4_);
              }
              iVar4 = 0x431;
            }
            else {
              puVar5 = (undefined8 *)CONCAT44(local_118._12_4_,local_118._8_4_);
              if (puVar5 != (undefined8 *)0x0) {
                if ((undefined8 *)*puVar5 != puVar5 + 2) {
                  operator_delete((undefined8 *)*puVar5);
                }
                operator_delete(puVar5);
              }
              local_118._16_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
              std::__cxx11::string::_M_construct((ulong)(local_118 + 0x10),'@');
              local_d8._0_8_ = local_d8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"big2","");
              DBTest::Get(&local_b8,&this->super_DBTest,(string *)local_d8,(Snapshot *)0x0);
              testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                        ((internal *)local_118,"std::string(200000, \'2\')","Get(\"big2\")",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_118 + 0x10),&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != paVar1) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
              if ((AssertHelperData *)local_d8._0_8_ != (AssertHelperData *)(local_d8 + 0x10)) {
                operator_delete((void *)local_d8._0_8_);
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_118._16_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
                operator_delete((void *)local_118._16_8_);
              }
              if (local_118[0] == false) {
                testing::Message::Message((Message *)(local_118 + 0x10));
                if ((undefined8 *)CONCAT44(local_118._12_4_,local_118._8_4_) == (undefined8 *)0x0) {
                  pcVar6 = "";
                }
                else {
                  pcVar6 = *(char **)CONCAT44(local_118._12_4_,local_118._8_4_);
                }
                iVar4 = 0x432;
              }
              else {
                puVar5 = (undefined8 *)CONCAT44(local_118._12_4_,local_118._8_4_);
                if (puVar5 != (undefined8 *)0x0) {
                  if ((undefined8 *)*puVar5 != puVar5 + 2) {
                    operator_delete((undefined8 *)*puVar5);
                  }
                  operator_delete(puVar5);
                }
                local_118._16_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
                std::__cxx11::string::_M_construct((ulong)(local_118 + 0x10),'\n');
                local_d8._0_8_ = local_d8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"small3","");
                DBTest::Get(&local_b8,&this->super_DBTest,(string *)local_d8,(Snapshot *)0x0);
                testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                          ((internal *)local_118,"std::string(10, \'3\')","Get(\"small3\")",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_118 + 0x10),&local_b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_b8._M_dataplus._M_p);
                }
                if ((AssertHelperData *)local_d8._0_8_ != (AssertHelperData *)(local_d8 + 0x10)) {
                  operator_delete((void *)local_d8._0_8_);
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_118._16_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
                  operator_delete((void *)local_118._16_8_);
                }
                if (local_118[0] != false) {
                  puVar5 = (undefined8 *)CONCAT44(local_118._12_4_,local_118._8_4_);
                  if (puVar5 != (undefined8 *)0x0) {
                    if ((undefined8 *)*puVar5 != puVar5 + 2) {
                      operator_delete((undefined8 *)*puVar5);
                    }
                    operator_delete(puVar5);
                  }
                  local_118._16_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                  ;
                  std::__cxx11::string::_M_construct((ulong)(local_118 + 0x10),'\n');
                  local_d8._0_8_ = local_d8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"small4","");
                  DBTest::Get(&local_b8,&this->super_DBTest,(string *)local_d8,(Snapshot *)0x0);
                  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                            ((internal *)local_118,"std::string(10, \'4\')","Get(\"small4\")",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_118 + 0x10),&local_b8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_b8._M_dataplus._M_p);
                  }
                  if ((AssertHelperData *)local_d8._0_8_ != (AssertHelperData *)(local_d8 + 0x10)) {
                    operator_delete((void *)local_d8._0_8_);
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_118._16_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8)
                  {
                    operator_delete((void *)local_118._16_8_);
                  }
                  if (local_118[0] == false) {
                    testing::Message::Message((Message *)(local_118 + 0x10));
                    if ((undefined8 *)CONCAT44(local_118._12_4_,local_118._8_4_) ==
                        (undefined8 *)0x0) {
                      pcVar6 = "";
                    }
                    else {
                      pcVar6 = *(char **)CONCAT44(local_118._12_4_,local_118._8_4_);
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                               ,0x434,pcVar6);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b8,(Message *)(local_118 + 0x10));
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
                    if ((AssertHelperData *)local_118._16_8_ != (AssertHelperData *)0x0) {
                      (**(code **)(*(size_type *)local_118._16_8_ + 8))();
                    }
                    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_118;
                  }
                  else {
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
                    iVar4 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,0);
                    local_b8._M_dataplus._M_p._0_4_ = iVar4;
                    local_d8._0_4_ = 1;
                    testing::internal::CmpHelperGT<int,int>
                              ((internal *)(local_118 + 0x10),"NumTableFilesAtLevel(0)","1",
                               (int *)&local_b8,(int *)local_d8);
                    if (local_118[0x10] == '\0') {
                      testing::Message::Message((Message *)&local_b8);
                      if ((undefined8 *)local_118._24_8_ == (undefined8 *)0x0) {
                        pcVar6 = "";
                      }
                      else {
                        pcVar6 = *(char **)local_118._24_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)local_d8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                                 ,0x435,pcVar6);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)local_d8,(Message *)&local_b8);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_b8._M_dataplus._M_p !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
                        (**(code **)(*(size_type *)local_b8._M_dataplus._M_p + 8))();
                      }
                    }
                    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_118 + 0x10);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)this_00);
                  return;
                }
                testing::Message::Message((Message *)(local_118 + 0x10));
                if ((undefined8 *)CONCAT44(local_118._12_4_,local_118._8_4_) == (undefined8 *)0x0) {
                  pcVar6 = "";
                }
                else {
                  pcVar6 = *(char **)CONCAT44(local_118._12_4_,local_118._8_4_);
                }
                iVar4 = 0x433;
              }
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_b8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                       ,iVar4,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_b8,(Message *)(local_118 + 0x10));
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
            if ((AssertHelperData *)local_118._16_8_ != (AssertHelperData *)0x0) {
              (**(code **)(*(size_type *)local_118._16_8_ + 8))();
            }
            puVar5 = (undefined8 *)CONCAT44(local_118._12_4_,local_118._8_4_);
          }
          goto LAB_0011e3d8;
        }
        testing::Message::Message((Message *)(local_118 + 0x10));
        if (local_e0 == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = (char *)*local_e0;
        }
        iVar4 = 0x427;
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_b8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
             ,iVar4,pcVar6);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_b8,(Message *)(local_118 + 0x10));
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
  puVar5 = local_e0;
  if ((AssertHelperData *)local_118._16_8_ != (AssertHelperData *)0x0) {
    (**(code **)(*(size_type *)local_118._16_8_ + 8))();
    puVar5 = local_e0;
  }
LAB_0011e3d8:
  if (puVar5 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar5 != puVar5 + 2) {
      operator_delete((void *)*puVar5);
    }
    operator_delete(puVar5);
  }
  return;
}

Assistant:

TEST_F(DBTest, RecoverWithLargeLog) {
  {
    Options options = CurrentOptions();
    Reopen(&options);
    ASSERT_LEVELDB_OK(Put("big1", std::string(200000, '1')));
    ASSERT_LEVELDB_OK(Put("big2", std::string(200000, '2')));
    ASSERT_LEVELDB_OK(Put("small3", std::string(10, '3')));
    ASSERT_LEVELDB_OK(Put("small4", std::string(10, '4')));
    ASSERT_EQ(NumTableFilesAtLevel(0), 0);
  }

  // Make sure that if we re-open with a small write buffer size that
  // we flush table files in the middle of a large log file.
  Options options = CurrentOptions();
  options.write_buffer_size = 100000;
  Reopen(&options);
  ASSERT_EQ(NumTableFilesAtLevel(0), 3);
  ASSERT_EQ(std::string(200000, '1'), Get("big1"));
  ASSERT_EQ(std::string(200000, '2'), Get("big2"));
  ASSERT_EQ(std::string(10, '3'), Get("small3"));
  ASSERT_EQ(std::string(10, '4'), Get("small4"));
  ASSERT_GT(NumTableFilesAtLevel(0), 1);
}